

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O2

void HTS_gc2gc(HTS_Vocoder *v,double *c1,int m1,double g1,double *c2,int m2,double g2)

{
  int iVar1;
  double *pdVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  
  uVar9 = (ulong)m1;
  pdVar2 = v->gc2gc_buff;
  if (v->gc2gc_size < uVar9) {
    if (pdVar2 != (double *)0x0) {
      HTS_free(pdVar2);
    }
    pdVar2 = (double *)HTS_calloc((long)(m1 + 1),8);
    v->gc2gc_buff = pdVar2;
    v->gc2gc_size = uVar9;
  }
  HTS_movem(c1,pdVar2,m1 + 1);
  pdVar2 = v->gc2gc_buff;
  *c2 = *pdVar2;
  if (m2 < 1) {
    m2 = 0;
  }
  lVar3 = 0;
  for (uVar4 = 1; uVar4 != m2 + 1; uVar4 = uVar4 + 1) {
    iVar1 = (int)uVar4;
    uVar5 = iVar1 - 1;
    if ((long)uVar9 < (long)uVar4) {
      uVar5 = m1;
    }
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = 0;
    }
    dVar11 = 0.0;
    dVar10 = 0.0;
    lVar7 = lVar3;
    for (uVar8 = 1; uVar8 - uVar6 != 1; uVar8 = uVar8 + 1) {
      dVar10 = dVar10 + (double)(int)uVar8 * pdVar2[uVar8] * c2[lVar7];
      dVar11 = dVar11 + (double)(int)lVar7 * pdVar2[uVar8] * c2[lVar7];
      lVar7 = lVar7 + -1;
    }
    if ((long)uVar9 < (long)uVar4) {
      dVar10 = (dVar10 * g2 - dVar11 * g1) / (double)iVar1;
    }
    else {
      dVar10 = (dVar10 * g2 - dVar11 * g1) / (double)iVar1 + pdVar2[uVar4];
    }
    c2[uVar4] = dVar10;
    lVar3 = lVar3 + 1;
  }
  return;
}

Assistant:

static void HTS_gc2gc(HTS_Vocoder * v, double *c1, const int m1, const double g1, double *c2, const int m2, const double g2)
{
   int i, min, k, mk;
   double ss1, ss2, cc;

   if (m1 > v->gc2gc_size) {
      if (v->gc2gc_buff != NULL)
         HTS_free(v->gc2gc_buff);
      v->gc2gc_buff = (double *) HTS_calloc(m1 + 1, sizeof(double));
      v->gc2gc_size = m1;
   }

   HTS_movem(c1, v->gc2gc_buff, m1 + 1);

   c2[0] = v->gc2gc_buff[0];
   for (i = 1; i <= m2; i++) {
      ss1 = ss2 = 0.0;
      min = m1 < i ? m1 : i - 1;
      for (k = 1; k <= min; k++) {
         mk = i - k;
         cc = v->gc2gc_buff[k] * c2[mk];
         ss2 += k * cc;
         ss1 += mk * cc;
      }

      if (i <= m1)
         c2[i] = v->gc2gc_buff[i] + (g2 * ss2 - g1 * ss1) / i;
      else
         c2[i] = (g2 * ss2 - g1 * ss1) / i;
   }
}